

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Cord::Cord(Cord *this,string_view src,MethodIdentifier method)

{
  Nullable<CordRep_*> pCVar1;
  long sampling_stride;
  Nullable<const_char_*> data;
  ulong length;
  long *in_FS_OFFSET;
  
  data = src._M_str;
  length = src._M_len;
  if (length < 0x10) {
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    return;
  }
  pCVar1 = NewTree(data,length,(size_t)data);
  if (pCVar1 != (Nullable<CordRep_*>)0x0) {
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar1;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    if (in_FS_OFFSET[-0xb] < 2) {
      sampling_stride =
           cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58));
    }
    else {
      in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
      sampling_stride = 0;
    }
    if (sampling_stride < 1) {
      return;
    }
    cord_internal::CordzInfo::TrackCord((InlineData *)this,method,sampling_stride);
    return;
  }
  __assert_fail("rep",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                ,0x4e8,
                "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

Cord::Cord(absl::string_view src, MethodIdentifier method)
    : contents_(InlineData::kDefaultInit) {
  const size_t n = src.size();
  if (n <= InlineRep::kMaxInline) {
    contents_.set_data(src.data(), n);
  } else {
    CordRep* rep = NewTree(src.data(), n, 0);
    contents_.EmplaceTree(rep, method);
  }
}